

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O2

PriceField __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeAsDouble
          (PriceUpdateDecoder *this,ByteBuffer *buffer,FieldDef *field_def)

{
  FieldEncodingEnum FVar1;
  uint64_t uVar2;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX;
  anon_union_8_4_08ebdfac_for_PriceField_2 aVar3;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_00;
  float fVar4;
  double value;
  PriceField PVar5;
  
  FVar1 = field_def->encoding_;
  if (FVar1 == ZIGZAG) {
    uVar2 = tools::Varint::ReadU64(&buffer->super_InputStream);
    uVar2 = tools::Varint::ZigzagToLong(uVar2);
LAB_001ce5cd:
    value = EncodingUtil::DecodeDecimal(uVar2,field_def->scale_);
  }
  else if (FVar1 == FIXED8) {
    value = tools::ByteBuffer::ReadDouble(buffer);
  }
  else {
    if (FVar1 == VARINT) {
      uVar2 = tools::Varint::ReadU64(&buffer->super_InputStream);
      goto LAB_001ce5cd;
    }
    if (FVar1 != FIXED4) {
      SkipFieldValue(buffer,(FieldDef *)buffer);
      PriceField::PriceField((PriceField *)this);
      aVar3 = extraout_RDX_00;
      goto LAB_001ce5e1;
    }
    fVar4 = tools::ByteBuffer::ReadFloat(buffer);
    value = (double)fVar4;
  }
  PriceField::PriceField((PriceField *)this,value);
  aVar3 = extraout_RDX;
LAB_001ce5e1:
  PVar5.field_1.long_value_ = aVar3.long_value_;
  PVar5._0_8_ = this;
  return PVar5;
}

Assistant:

PriceField PriceUpdateDecoder::DecodeAsDouble(ByteBuffer& buffer, FieldDef& field_def)
{
    switch(field_def.encoding_)
    {
        case FIXED4:
            return PriceField((double) buffer.ReadFloat());
        case FIXED8:
            return PriceField(buffer.ReadDouble());
        case VARINT:
            return PriceField(EncodingUtil::DecodeDecimal(Varint::ReadU64(buffer), field_def.scale_));
        case ZIGZAG:
            return PriceField(EncodingUtil::DecodeDecimal(Varint::ZigzagToLong(Varint::ReadU64(buffer)), field_def.scale_));
    }
    SkipFieldValue(buffer, field_def);
    return PriceField();
}